

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O2

Ref cashew::ValueBuilder::makeVar(bool is_const)

{
  Ref RVar1;
  Ref r;
  Value *this;
  
  RVar1 = makeRawArray(2);
  r = makeRawString((IString *)VAR);
  this = cashew::Value::push_back(RVar1.inst,r);
  RVar1 = makeRawArray(0);
  RVar1.inst = cashew::Value::push_back(this,RVar1);
  return (Ref)RVar1.inst;
}

Assistant:

static Ref makeVar(bool is_const = false) {
    return &makeRawArray(2)
              ->push_back(makeRawString(VAR))
              .push_back(makeRawArray());
  }